

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate.cpp
# Opt level: O2

int main(void)

{
  short sVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  short local_38 [4];
  
  local_38[0] = 4;
  local_38[1] = 6;
  local_38[2] = 9;
  std::operator<<((ostream *)&std::cout,"\nThese are the contents.\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"EG.x = \t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x2a);
  std::operator<<(poVar2,'\n');
  poVar2 = std::operator<<((ostream *)&std::cout,"EG.y = \t");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35);
  std::operator<<(poVar2,'\n');
  lVar4 = 0;
  for (lVar3 = 6; lVar3 != 0; lVar3 = lVar3 + -2) {
    sVar1 = local_38[lVar4];
    poVar2 = std::operator<<((ostream *)&std::cout,"Z[");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar4);
    poVar2 = std::operator<<(poVar2,"] = \t");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,sVar1);
    std::operator<<(poVar2,'\n');
    lVar4 = lVar4 + 1;
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return 0;
}

Assistant:

int main() {
	D EG{ {42, 53}, {4,6,9} };
	std::cout << "\nThese are the contents.\n";

	std::cout<<"EG.x = \t" << EG.x << '\n';
	std::cout<<"EG.y = \t" << EG.y << '\n';

	int ix =0;
	for (short _z : EG.z) {
		std::cout<<"Z[" << ix << "] = \t" << _z << '\n';
		ix++;
	}
	std::cout << std::endl;
}